

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_qpak.c
# Opt level: O0

void * QPAK_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  int iVar1;
  PHYSFS_uint32 PVar2;
  PHYSFS_uint32 PVar3;
  void *unpkarc;
  PHYSFS_uint32 count;
  PHYSFS_uint32 pos;
  PHYSFS_uint32 val;
  int *claimed_local;
  char *pcStack_20;
  int forWriting_local;
  char *name_local;
  PHYSFS_Io *io_local;
  
  count = 0;
  _pos = claimed;
  claimed_local._4_4_ = forWriting;
  pcStack_20 = name;
  name_local = (char *)io;
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/REGoth-project[P]physfs/src/physfs_archiver_qpak.c"
                  ,0x43,"void *QPAK_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar1 = __PHYSFS_readAll(io,&count,4);
    if (iVar1 == 0) {
      io_local = (PHYSFS_Io *)0x0;
    }
    else {
      PVar2 = PHYSFS_swapULE32(count);
      if (PVar2 == 0x4b434150) {
        *_pos = 1;
        iVar1 = __PHYSFS_readAll((PHYSFS_Io *)name_local,&count,4);
        if (iVar1 == 0) {
          io_local = (PHYSFS_Io *)0x0;
        }
        else {
          PVar2 = PHYSFS_swapULE32(count);
          iVar1 = __PHYSFS_readAll((PHYSFS_Io *)name_local,&count,4);
          if (iVar1 == 0) {
            io_local = (PHYSFS_Io *)0x0;
          }
          else {
            PVar3 = PHYSFS_swapULE32(count);
            if ((PVar3 & 0x3f) == 0) {
              iVar1 = (**(code **)(name_local + 0x20))(name_local,PVar2);
              if (iVar1 == 0) {
                io_local = (PHYSFS_Io *)0x0;
              }
              else {
                io_local = (PHYSFS_Io *)UNPK_openArchive((PHYSFS_Io *)name_local);
                if (io_local == (PHYSFS_Io *)0x0) {
                  io_local = (PHYSFS_Io *)0x0;
                }
                else {
                  iVar1 = qpakLoadEntries((PHYSFS_Io *)name_local,PVar3 >> 6,io_local);
                  if (iVar1 == 0) {
                    UNPK_abandonArchive(io_local);
                    io_local = (PHYSFS_Io *)0x0;
                  }
                }
              }
            }
            else {
              PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
              io_local = (PHYSFS_Io *)0x0;
            }
          }
        }
      }
      else {
        PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
        io_local = (PHYSFS_Io *)0x0;
      }
    }
  }
  else {
    PHYSFS_setErrorCode(PHYSFS_ERR_READ_ONLY);
    io_local = (PHYSFS_Io *)0x0;
  }
  return io_local;
}

Assistant:

static void *QPAK_openArchive(PHYSFS_Io *io, const char *name,
                              int forWriting, int *claimed)
{
    PHYSFS_uint32 val = 0;
    PHYSFS_uint32 pos = 0;
    PHYSFS_uint32 count = 0;
    void *unpkarc;

    assert(io != NULL);  /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &val, 4), NULL);
    if (PHYSFS_swapULE32(val) != QPAK_SIG)
        BAIL(PHYSFS_ERR_UNSUPPORTED, NULL);

    *claimed = 1;

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &val, 4), NULL);
    pos = PHYSFS_swapULE32(val);  /* directory table offset. */

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &val, 4), NULL);
    count = PHYSFS_swapULE32(val);

    /* corrupted archive? */
    BAIL_IF((count % 64) != 0, PHYSFS_ERR_CORRUPT, NULL);
    count /= 64;

    BAIL_IF_ERRPASS(!io->seek(io, pos), NULL);

    unpkarc = UNPK_openArchive(io);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!qpakLoadEntries(io, count, unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}